

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ExperimentResult.cpp
# Opt level: O1

double __thiscall celero::ExperimentResult::getBaselineMeasurement(ExperimentResult *this)

{
  long lVar1;
  _Tuple_impl<0UL,_celero::ExperimentResult::Impl_*,_std::default_delete<celero::ExperimentResult::Impl>_>
  _Var2;
  bool bVar3;
  double extraout_XMM0_Qa;
  double extraout_XMM0_Qa_00;
  double dVar4;
  double dVar5;
  shared_ptr<celero::Experiment> baselineExperiment;
  shared_ptr<celero::ExperimentResult> baselineResult;
  shared_ptr<celero::Benchmark> bm;
  long local_48;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *local_40;
  __uniq_ptr_impl<celero::Experiment::Impl,_std::default_delete<celero::Experiment::Impl>_> local_38
  ;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *local_30;
  __uniq_ptr_impl<celero::Experiment::Impl,_std::default_delete<celero::Experiment::Impl>_> local_28
  ;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *local_20;
  
  bVar3 = Experiment::getIsBaselineCase
                    (*(Experiment **)
                      ((long)(this->pimpl)._pimpl._M_t.
                             super___uniq_ptr_impl<celero::ExperimentResult::Impl,_std::default_delete<celero::ExperimentResult::Impl>_>
                             ._M_t.
                             super__Tuple_impl<0UL,_celero::ExperimentResult::Impl_*,_std::default_delete<celero::ExperimentResult::Impl>_>
                             .super__Head_base<0UL,_celero::ExperimentResult::Impl_*,_false> + 0x98)
                    );
  if (bVar3) {
    return 1.0;
  }
  Experiment::getBenchmark((Experiment *)&local_28);
  if (local_28._M_t.
      super__Tuple_impl<0UL,_celero::Experiment::Impl_*,_std::default_delete<celero::Experiment::Impl>_>
      .super__Head_base<0UL,_celero::Experiment::Impl_*,_false>._M_head_impl !=
      (_Tuple_impl<0UL,_celero::Experiment::Impl_*,_std::default_delete<celero::Experiment::Impl>_>)
      0x0) {
    Benchmark::getBaseline
              ((Benchmark *)
               local_28._M_t.
               super__Tuple_impl<0UL,_celero::Experiment::Impl_*,_std::default_delete<celero::Experiment::Impl>_>
               .super__Head_base<0UL,_celero::Experiment::Impl_*,_false>._M_head_impl);
    if (local_48 == 0) {
      bVar3 = true;
      dVar4 = extraout_XMM0_Qa;
    }
    else {
      Experiment::getResultByValue((Experiment *)&local_38,local_48);
      dVar4 = extraout_XMM0_Qa_00;
      if ((_Tuple_impl<0UL,_celero::Experiment::Impl_*,_std::default_delete<celero::Experiment::Impl>_>
           )local_38._M_t.
            super__Tuple_impl<0UL,_celero::Experiment::Impl_*,_std::default_delete<celero::Experiment::Impl>_>
            .super__Head_base<0UL,_celero::Experiment::Impl_*,_false>._M_head_impl == (Impl *)0x0) {
        bVar3 = true;
      }
      else {
        lVar1 = *(long *)local_38._M_t.
                         super__Tuple_impl<0UL,_celero::Experiment::Impl_*,_std::default_delete<celero::Experiment::Impl>_>
                         .super__Head_base<0UL,_celero::Experiment::Impl_*,_false>._M_head_impl;
        bVar3 = true;
        if (*(char *)(lVar1 + 0xa1) == '\0') {
          dVar4 = (double)*(long *)(lVar1 + 0x28) /
                  (double)*(long *)(*(long *)(lVar1 + 0x80) + 0x10);
          bVar3 = dVar4 <= 0.0;
        }
        if (!bVar3) {
          _Var2.super__Head_base<0UL,_celero::ExperimentResult::Impl_*,_false>._M_head_impl =
               (this->pimpl)._pimpl._M_t.
               super___uniq_ptr_impl<celero::ExperimentResult::Impl,_std::default_delete<celero::ExperimentResult::Impl>_>
               ._M_t.
               super__Tuple_impl<0UL,_celero::ExperimentResult::Impl_*,_std::default_delete<celero::ExperimentResult::Impl>_>
               .super__Head_base<0UL,_celero::ExperimentResult::Impl_*,_false>;
          dVar5 = 0.0;
          dVar4 = 0.0;
          if (*(char *)((long)_Var2.super__Head_base<0UL,_celero::ExperimentResult::Impl_*,_false>.
                              _M_head_impl + 0xa1) == '\0') {
            dVar4 = (double)*(long *)((long)_Var2.
                                            super__Head_base<0UL,_celero::ExperimentResult::Impl_*,_false>
                                            ._M_head_impl + 0x28) /
                    (double)*(long *)(*(long *)((long)_Var2.
                                                  super__Head_base<0UL,_celero::ExperimentResult::Impl_*,_false>
                                                  ._M_head_impl + 0x80) + 0x10);
          }
          if (*(char *)(lVar1 + 0xa1) == '\0') {
            dVar5 = (double)*(long *)(lVar1 + 0x28) /
                    (double)*(long *)(*(long *)(lVar1 + 0x80) + 0x10);
          }
          dVar4 = dVar4 / dVar5;
        }
      }
      if (local_30 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
        std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(local_30);
      }
    }
    if (local_40 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
      std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(local_40);
    }
    if (!bVar3) goto LAB_00134321;
  }
  dVar4 = -1.0;
LAB_00134321:
  if (local_20 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(local_20);
  }
  return dVar4;
}

Assistant:

double ExperimentResult::getBaselineMeasurement() const
{
	if(this->pimpl->parent->getIsBaselineCase() == false)
	{
		const auto bm = this->pimpl->parent->getBenchmark();

		if(bm != nullptr)
		{
			const auto baselineExperiment = bm->getBaseline();

			if(baselineExperiment != nullptr)
			{
				const auto baselineResult = baselineExperiment->getResultByValue(this->getProblemSpaceValue());

				if(baselineResult != nullptr)
				{
					const auto baselineResultUs = baselineResult->getUsPerCall();

					// Prevent possible divide by zero.
					if(baselineResultUs > 0)
					{
						return this->getUsPerCall() / baselineResult->getUsPerCall();
					}
				}
			}
		}

		return -1.0;
	}

	return 1.0;
}